

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  uint uVar1;
  int iVar2;
  WalCkptInfo *pWVar3;
  WalIndexHdr *pWVar4;
  int local_4c;
  int local_44;
  u32 thisMark;
  int nDelay;
  int rc;
  int i;
  int mxI;
  u32 mxReadMark;
  WalCkptInfo *pInfo;
  int cnt_local;
  int useWal_local;
  int *pChanged_local;
  Wal *pWal_local;
  
  thisMark = 0;
  if (5 < cnt) {
    local_44 = 1;
    if (100 < cnt) {
      return 0xf;
    }
    if (9 < cnt) {
      local_44 = (cnt + -9) * 0xee;
    }
    sqlite3OsSleep(pWal->pVfs,local_44);
  }
  if (useWal == 0) {
    thisMark = walIndexReadHdr(pWal,pChanged);
    if (thisMark == 5) {
      if (*pWal->apWiData == (u32 *)0x0) {
        thisMark = 0xffffffff;
      }
      else {
        thisMark = walLockShared(pWal,2);
        if (thisMark == 0) {
          walUnlockShared(pWal,2);
          thisMark = 0xffffffff;
        }
        else if (thisMark == 5) {
          thisMark = 0x105;
        }
      }
    }
    if (thisMark != 0) {
      return thisMark;
    }
  }
  pWVar3 = walCkptInfo(pWal);
  if ((useWal == 0) && (pWVar3->nBackfill == (pWal->hdr).mxFrame)) {
    iVar2 = walLockShared(pWal,3);
    walShmBarrier(pWal);
    if (iVar2 == 0) {
      pWVar4 = walIndexHdr(pWal);
      iVar2 = memcmp(pWVar4,&pWal->hdr,0x30);
      if (iVar2 != 0) {
        walUnlockShared(pWal,3);
        return -1;
      }
      pWal->readLock = 0;
      return 0;
    }
    if (iVar2 != 5) {
      return iVar2;
    }
    thisMark = 5;
  }
  i = 0;
  rc = 0;
  for (nDelay = 1; nDelay < 5; nDelay = nDelay + 1) {
    uVar1 = pWVar3->aReadMark[nDelay];
    if (((uint)i <= uVar1) && (uVar1 <= (pWal->hdr).mxFrame)) {
      rc = nDelay;
      i = uVar1;
    }
  }
  if (((pWal->readOnly & 2) == 0) && (((uint)i < (pWal->hdr).mxFrame || (rc == 0)))) {
    for (nDelay = 1; nDelay < 5; nDelay = nDelay + 1) {
      thisMark = walLockExclusive(pWal,nDelay + 3,1);
      if (thisMark == 0) {
        i = (pWal->hdr).mxFrame;
        pWVar3->aReadMark[nDelay] = i;
        rc = nDelay;
        walUnlockExclusive(pWal,nDelay + 3,1);
        break;
      }
      if (thisMark != 5) {
        return thisMark;
      }
    }
  }
  if (rc == 0) {
    pWal_local._4_4_ = 0x208;
    if (thisMark == 5) {
      pWal_local._4_4_ = -1;
    }
  }
  else {
    local_4c = walLockShared(pWal,rc + 3);
    if (local_4c == 0) {
      walShmBarrier(pWal);
      if (pWVar3->aReadMark[rc] == i) {
        pWVar4 = walIndexHdr(pWal);
        iVar2 = memcmp(pWVar4,&pWal->hdr,0x30);
        if (iVar2 == 0) {
          pWal->readLock = (i16)rc;
          return 0;
        }
      }
      walUnlockShared(pWal,rc + 3);
      pWal_local._4_4_ = -1;
    }
    else {
      if (local_4c == 5) {
        local_4c = -1;
      }
      pWal_local._4_4_ = local_4c;
    }
  }
  return pWal_local._4_4_;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But 
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve, 
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer, 
  ** so that on the 100th (and last) RETRY we delay for 21 milliseconds.
  ** The total delay time before giving up is less than 1 second.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*238;  /* Max delay 21ms. Total delay 996ms */
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    rc = walIndexReadHdr(pWal, pChanged);
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS 
        ** modules may return SQLITE_BUSY due to a race condition in the 
        ** code that determines whether or not the shared-memory region 
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }

  pInfo = walCkptInfo(pWal);
  if( !useWal && pInfo->nBackfill==pWal->hdr.mxFrame ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshoT. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log 
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = pInfo->aReadMark[i];
    if( mxReadMark<=thisMark && thisMark<=pWal->hdr.mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  /* There was once an "if" here. The extra "{" is to preserve indentation. */
  {
    if( (pWal->readOnly & WAL_SHM_RDONLY)==0
     && (mxReadMark<pWal->hdr.mxFrame || mxI==0)
    ){
      for(i=1; i<WAL_NREADER; i++){
        rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
        if( rc==SQLITE_OK ){
          mxReadMark = pInfo->aReadMark[i] = pWal->hdr.mxFrame;
          mxI = i;
          walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
          break;
        }else if( rc!=SQLITE_BUSY ){
          return rc;
        }
      }
    }
    if( mxI==0 ){
      assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
      return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTLOCK;
    }

    rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
    if( rc ){
      return rc==SQLITE_BUSY ? WAL_RETRY : rc;
    }
    /* Now that the read-lock has been obtained, check that neither the
    ** value in the aReadMark[] array or the contents of the wal-index
    ** header have changed.
    **
    ** It is necessary to check that the wal-index header did not change
    ** between the time it was read and when the shared-lock was obtained
    ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
    ** that the log file may have been wrapped by a writer, or that frames
    ** that occur later in the log than pWal->hdr.mxFrame may have been
    ** copied into the database by a checkpointer. If either of these things
    ** happened, then reading the database with the current value of
    ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
    ** instead.
    **
    ** This does not guarantee that the copy of the wal-index header is up to
    ** date before proceeding. That would not be possible without somehow
    ** blocking writers. It only guarantees that a dangerous checkpoint or 
    ** log-wrap (either of which would require an exclusive lock on
    ** WAL_READ_LOCK(mxI)) has not occurred since the snapshot was valid.
    */
    walShmBarrier(pWal);
    if( pInfo->aReadMark[mxI]!=mxReadMark
     || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
    ){
      walUnlockShared(pWal, WAL_READ_LOCK(mxI));
      return WAL_RETRY;
    }else{
      assert( mxReadMark<=pWal->hdr.mxFrame );
      pWal->readLock = (i16)mxI;
    }
  }
  return rc;
}